

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxClassTypeCast::Resolve(FxClassTypeCast *this,FCompileContext *ctx)

{
  PPointer *this_00;
  PClassPointer *valtype;
  PType *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  char *pcVar4;
  FxNameCast *this_02;
  FxConstant *this_03;
  char *message;
  ExpVal *this_04;
  char *pcVar5;
  FName clsname;
  FName local_34;
  ExpVal local_30;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->basex == (FxExpression *)0x0) {
LAB_00519e6d:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  iVar2 = (*this->basex->_vptr_FxExpression[2])();
  this_03 = (FxConstant *)CONCAT44(extraout_var,iVar2);
  this->basex = (FxExpression *)this_03;
  if (this_03 == (FxConstant *)0x0) goto LAB_00519e6d;
  this_00 = (PPointer *)(this_03->super_FxExpression).ValueType;
  valtype = (PClassPointer *)(this->super_FxExpression).ValueType;
  if (this_00 != TypeNullPtr) {
    pPVar3 = DObject::GetClass((DObject *)this_00);
    this_01 = this->basex->ValueType;
    if (pPVar3 != PClassPointer::RegistrationInfo.MyClass) {
      if ((this_01 != (PType *)TypeName) && (this_01 != (PType *)TypeString)) {
        pcVar4 = PType::DescriptiveName(this_01);
        this_03 = (FxConstant *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Cannot convert %s to class type",
                   pcVar4);
        goto LAB_00519ea3;
      }
      iVar2 = (*this->basex->_vptr_FxExpression[3])();
      if ((char)iVar2 == '\0') {
        if (this->basex->ValueType != (PType *)TypeString) {
          return &this->super_FxExpression;
        }
        this_02 = (FxNameCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)ctx);
        FxNameCast::FxNameCast(this_02,this->basex);
        this->basex = (FxExpression *)this_02;
        return &this->super_FxExpression;
      }
      this_04 = &local_30;
      ExpVal::ExpVal(this_04,(ExpVal *)(this->basex + 1));
      ExpVal::GetName((ExpVal *)&clsname);
      ExpVal::~ExpVal(&local_30);
      if (clsname.Index == 0) {
        pPVar3 = (PClass *)0x0;
      }
      else {
        local_34.Index = clsname.Index;
        pPVar3 = PClass::FindClass(&local_34);
        if (pPVar3 == (PClass *)0x0) {
          pcVar4 = FName::NameData.NameArray[clsname.Index].Text;
          pcVar5 = FName::NameData.NameArray
                   [(this->desttype->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.
                    Index].Text;
          message = "Unknown class name \'%s\' of type \'%s\'";
        }
        else {
          bVar1 = PClass::IsAncestorOf(this->desttype,pPVar3);
          pcVar4 = FName::NameData.NameArray[clsname.Index].Text;
          if (bVar1) {
            this_04 = (ExpVal *)0x8;
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,8,"resolving \'%s\' as class name"
                       ,pcVar4);
            goto LAB_0051a044;
          }
          pcVar5 = FName::NameData.NameArray
                   [(this->desttype->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.
                    Index].Text;
          message = "class \'%s\' is not compatible with \'%s\'";
        }
        pPVar3 = (PClass *)0x0;
        this_04 = (ExpVal *)0x3;
        FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,3,message,pcVar4,pcVar5)
        ;
      }
LAB_0051a044:
      this_03 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)this_04);
      FxConstant::FxConstant(this_03,pPVar3,valtype,&(this->super_FxExpression).ScriptPosition);
      goto LAB_00519ea3;
    }
    bVar1 = PClass::IsAncestorOf
                      (valtype->ClassRestriction,
                       (PClass *)this_01[1].super_PTypeBase.super_DObject.ObjNext);
    if (!bVar1) {
      this_03 = (FxConstant *)0x0;
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "Cannot convert from %s to %s: Incompatible class types",
                 FName::NameData.NameArray
                 [*(int *)&this_01[1].super_PTypeBase.super_DObject.ObjNext[4]._vptr_DObject].Text,
                 FName::NameData.NameArray
                 [(valtype->ClassRestriction->super_PNativeStruct).super_PStruct.super_PNamedType.
                  TypeName.Index].Text);
      goto LAB_00519ea3;
    }
    this_03 = (FxConstant *)this->basex;
  }
  (this_03->super_FxExpression).ValueType = (PType *)valtype;
  this->basex = (FxExpression *)0x0;
LAB_00519ea3:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return &this_03->super_FxExpression;
}

Assistant:

FxExpression *FxClassTypeCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeNullPtr)
	{
		basex->ValueType = ValueType;
		auto x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	auto to = static_cast<PClassPointer *>(ValueType);
	if (basex->ValueType->GetClass() == RUNTIME_CLASS(PClassPointer))
	{
		auto from = static_cast<PClassPointer *>(basex->ValueType);
		if (from->ClassRestriction->IsDescendantOf(to->ClassRestriction))
		{
			basex->ValueType = to;
			auto x = basex;
			basex = nullptr;
			delete this;
			return x;
		}
		ScriptPosition.Message(MSG_ERROR, "Cannot convert from %s to %s: Incompatible class types", from->ClassRestriction->TypeName.GetChars(), to->ClassRestriction->TypeName.GetChars());
		delete this;
		return nullptr;
	}
	
	if (basex->ValueType != TypeName && basex->ValueType != TypeString)
	{
		ScriptPosition.Message(MSG_ERROR, "Cannot convert %s to class type", basex->ValueType->DescriptiveName());
		delete this;
		return nullptr;
	}

	if (basex->isConstant())
	{
		FName clsname = static_cast<FxConstant *>(basex)->GetValue().GetName();
		PClass *cls = nullptr;

		if (clsname != NAME_None)
		{
			cls = PClass::FindClass(clsname);
			if (cls == nullptr)
			{
				/* lax */
				// Since this happens in released WADs it must pass without a terminal error... :(
				ScriptPosition.Message(MSG_OPTERROR,
					"Unknown class name '%s' of type '%s'",
					clsname.GetChars(), desttype->TypeName.GetChars());
			}
			else
			{
				if (!cls->IsDescendantOf(desttype))
				{
					ScriptPosition.Message(MSG_OPTERROR, "class '%s' is not compatible with '%s'", clsname.GetChars(), desttype->TypeName.GetChars());
					cls = nullptr;
				}
				else ScriptPosition.Message(MSG_DEBUGLOG, "resolving '%s' as class name", clsname.GetChars());
			}
		}
		FxExpression *x = new FxConstant(cls, to, ScriptPosition);
		delete this;
		return x;
	}
	if (basex->ValueType == TypeString)
	{
		basex = new FxNameCast(basex);
	}
	return this;
}